

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnMemory
          (BinaryReaderObjdump *this,Index index,Limits *page_limits,uint32_t page_size)

{
  uint32_t page_size_local;
  Limits *page_limits_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  PrintDetails(this," - memory[%u] pages: initial=%ld",(ulong)index,page_limits->initial);
  if ((page_limits->has_max & 1U) != 0) {
    PrintDetails(this," max=%ld",page_limits->max);
  }
  if ((page_limits->is_shared & 1U) != 0) {
    PrintDetails(this," shared");
  }
  if ((page_limits->is_64 & 1U) != 0) {
    PrintDetails(this," i64");
  }
  if (page_size != 0x10000) {
    PrintDetails(this," (pagesize %u)",(ulong)page_size);
  }
  PrintDetails(this,"\n");
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnMemory(Index index,
                                     const Limits* page_limits,
                                     uint32_t page_size) {
  PrintDetails(" - memory[%" PRIindex "] pages: initial=%" PRId64, index,
               page_limits->initial);
  if (page_limits->has_max) {
    PrintDetails(" max=%" PRId64, page_limits->max);
  }
  if (page_limits->is_shared) {
    PrintDetails(" shared");
  }
  if (page_limits->is_64) {
    PrintDetails(" i64");
  }
  if (page_size != WABT_DEFAULT_PAGE_SIZE) {
    PrintDetails(" (pagesize %u)", page_size);
  }
  PrintDetails("\n");
  return Result::Ok;
}